

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

RefToken __thiscall antlr::TokenBuffer::LT(TokenBuffer *this,uint i)

{
  size_t in_RSI;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *in_RDI;
  TokenBuffer *unaff_retaddr;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *this_00;
  
  this_00 = in_RDI;
  fill(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  CircularQueue<antlr::TokenRefCount<antlr::Token>_>::elementAt(this_00,in_RSI);
  return (RefToken)(TokenRef *)in_RDI;
}

Assistant:

RefToken TokenBuffer::LT(unsigned int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1);
}